

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  ImVec2 IVar3;
  
  IVar7 = ImGuiWindow::Rect(window);
  IVar3 = IVar7.Max;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    IVar3.x = IVar7.Max.x + -1.0;
    IVar3.y = IVar7.Max.y + -1.0;
  }
  fVar1 = IVar7.Min.y;
  fVar2 = IVar3.x;
  switch(border_n) {
  case 0:
    break;
  case 1:
    goto LAB_001427a0;
  case 2:
    fVar1 = IVar3.y;
    break;
  case 3:
    fVar2 = IVar7.Min.x;
LAB_001427a0:
    fVar5 = fVar1 + perp_padding;
    fVar6 = thickness + fVar2;
    fVar4 = fVar2 - thickness;
    fVar1 = IVar3.y - perp_padding;
    goto LAB_001427aa;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                  ,0x13f2,"ImRect GetResizeBorderRect(ImGuiWindow *, int, float, float)");
  }
  fVar4 = IVar7.Min.x + perp_padding;
  fVar5 = fVar1 - thickness;
  fVar6 = fVar2 - perp_padding;
  fVar1 = fVar1 + thickness;
LAB_001427aa:
  IVar7.Max.y = fVar1;
  IVar7.Max.x = fVar6;
  IVar7.Min.y = fVar5;
  IVar7.Min.x = fVar4;
  return IVar7;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1, 1);
    if (border_n == 0) { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    } // Top
    if (border_n == 1) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); } // Right
    if (border_n == 2) { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    } // Bottom
    if (border_n == 3) { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); } // Left
    IM_ASSERT(0);
    return ImRect();
}